

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2builder.cc
# Opt level: O0

void __thiscall
S2Builder::MaybeAddInputVertex
          (S2Builder *this,InputVertexId v,SiteId id,
          vector<gtl::compact_array<int,_std::allocator<int>_>,_std::allocator<gtl::compact_array<int,_std::allocator<int>_>_>_>
          *site_vertices)

{
  bool bVar1;
  compact_array_base<int,_std::allocator<int>_> *this_00;
  reference pvVar2;
  value_type *vertices;
  vector<gtl::compact_array<int,_std::allocator<int>_>,_std::allocator<gtl::compact_array<int,_std::allocator<int>_>_>_>
  *site_vertices_local;
  SiteId id_local;
  InputVertexId v_local;
  S2Builder *this_local;
  
  site_vertices_local._0_4_ = id;
  site_vertices_local._4_4_ = v;
  _id_local = this;
  bVar1 = std::
          vector<gtl::compact_array<int,_std::allocator<int>_>,_std::allocator<gtl::compact_array<int,_std::allocator<int>_>_>_>
          ::empty(site_vertices);
  if (!bVar1) {
    this_00 = &std::
               vector<gtl::compact_array<int,_std::allocator<int>_>,_std::allocator<gtl::compact_array<int,_std::allocator<int>_>_>_>
               ::operator[](site_vertices,(long)(SiteId)site_vertices_local)->
               super_compact_array_base<int,_std::allocator<int>_>;
    bVar1 = gtl::compact_array_base<int,_std::allocator<int>_>::empty(this_00);
    if ((bVar1) ||
       (pvVar2 = gtl::compact_array_base<int,_std::allocator<int>_>::back(this_00),
       *pvVar2 != site_vertices_local._4_4_)) {
      gtl::compact_array_base<int,_std::allocator<int>_>::push_back
                (this_00,(value_type_conflict1 *)((long)&site_vertices_local + 4));
    }
  }
  return;
}

Assistant:

inline void S2Builder::MaybeAddInputVertex(
    InputVertexId v, SiteId id,
    vector<compact_array<InputVertexId>>* site_vertices) const {
  if (site_vertices->empty()) return;

  // Optimization: check if we just added this vertex.  This is worthwhile
  // because the input edges usually form a continuous chain, i.e. the
  // destination of one edge is the same as the source of the next edge.
  auto& vertices = (*site_vertices)[id];
  if (vertices.empty() || vertices.back() != v) {
    vertices.push_back(v);
  }
}